

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::DoInterruptProbes(Lowerer *this)

{
  Instr **ppIVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *loopLabel;
  LabelInstr *labelInstr;
  Instr *pIVar6;
  Instr *this_00;
  uint32 number;
  
  pFVar2 = this->m_func;
  pFVar2->topFunc->hasInstrNumber = true;
  this_00 = pFVar2->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    number = 1;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar6 = (Instr *)0x0;
    do {
      if ((pIVar6 != (Instr *)0x0) && (pIVar6->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x157c,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      IR::Instr::SetNumber(this_00,number);
      if (((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) &&
         (((ulong)this_00[1].m_func & 1) != 0)) {
        loopLabel = IR::LabelInstr::New(Label,this->m_func,false);
        IR::Instr::InsertAfter(this_00,&loopLabel->super_Instr);
        InsertOneLoopProbe(this,&loopLabel->super_Instr,loopLabel);
      }
      ppIVar1 = &this_00->m_next;
      number = number + 1;
      pIVar6 = this_00;
      this_00 = *ppIVar1;
    } while (*ppIVar1 != (Instr *)0x0);
  }
  return;
}

Assistant:

void
Lowerer::DoInterruptProbes()
{
    this->m_func->SetHasInstrNumber(true);
    uint instrCount = 1;
    FOREACH_INSTR_IN_FUNC(instr, this->m_func)
    {
        instr->SetNumber(instrCount++);
        if (instr->IsLabelInstr())
        {
            IR::LabelInstr *labelInstr = instr->AsLabelInstr();
            if (labelInstr->m_isLoopTop)
            {
                // For every loop top label, insert the following:

                //   cmp sp, ThreadContext::stackLimitForCurrentThread
                //   bgt $continue
                // $helper:
                //   call JavascriptOperators::ScriptAbort
                //   b $exit
                // $continue:

                IR::LabelInstr *newLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                labelInstr->InsertAfter(newLabel);
                this->InsertOneLoopProbe(newLabel, newLabel);
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
}